

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosh.c
# Opt level: O0

double c_cosh(double x)

{
  int iVar1;
  double dVar2;
  double y;
  double x_local;
  
  iVar1 = isnan(x);
  x_local = x;
  if (iVar1 == 0) {
    y = x;
    if (x < 0.0) {
      y = -x;
    }
    if (y <= MAXLOG + LOGE2) {
      if (y < MAXLOG - LOGE2) {
        dVar2 = c_exp(y);
        x_local = (dVar2 + 1.0 / dVar2) * 0.5;
      }
      else {
        dVar2 = c_exp(y * 0.5);
        x_local = dVar2 * 0.5 * dVar2;
      }
    }
    else {
      mtherr("cosh",3);
      x_local = INFINITY;
    }
  }
  return x_local;
}

Assistant:

double c_cosh(x)
double x;
{
double y;

#ifdef NANS
if( isnan(x) )
	return(x);
#endif
if( x < 0 )
	x = -x;
if( x > (MAXLOG + LOGE2) )
	{
	mtherr( "cosh", OVERFLOW );
	return( INFINITY );
	}	
if( x >= (MAXLOG - LOGE2) )
	{
	y = c_exp(0.5 * x);
	y = (0.5 * y) * y;
	return(y);
	}
y = c_exp(x);
y = 0.5 * (y + 1.0 / y);
return( y );
}